

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorNode::DescriptorNode(DescriptorNode *this,DescriptorNode *object)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  DescriptorNodeType DVar3;
  DescriptorScriptType DVar4;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  (this->key_info_)._M_dataplus._M_p = (pointer)&(this->key_info_).field_2;
  (this->key_info_)._M_string_length = 0;
  (this->key_info_).field_2._M_local_buf[0] = '\0';
  this->is_uncompressed_key_ = false;
  (this->base_extkey_)._M_dataplus._M_p = (pointer)&(this->base_extkey_).field_2;
  (this->base_extkey_)._M_string_length = 0;
  (this->base_extkey_).field_2._M_local_buf[0] = '\0';
  (this->tweak_sum_)._M_dataplus._M_p = (pointer)&(this->tweak_sum_).field_2;
  (this->tweak_sum_)._M_string_length = 0;
  (this->tweak_sum_).field_2._M_local_buf[0] = '\0';
  this->number_ = 0;
  (this->child_node_).
  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->child_node_).
  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_node_).
  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->tree_node_)._M_t._M_impl.super__Rb_tree_header;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->checksum_)._M_dataplus._M_p = (pointer)&(this->checksum_).field_2;
  (this->checksum_)._M_string_length = 0;
  (this->checksum_).field_2._M_local_buf[0] = '\0';
  this->depth_ = 0;
  this->need_arg_num_ = 0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parent_kind_)._M_dataplus._M_p = (pointer)&(this->parent_kind_).field_2;
  (this->parent_kind_)._M_string_length = 0;
  (this->parent_kind_).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)this);
  ::std::__cxx11::string::_M_assign((string *)&this->value_);
  ::std::__cxx11::string::_M_assign((string *)&this->key_info_);
  this->is_uncompressed_key_ = object->is_uncompressed_key_;
  ::std::__cxx11::string::_M_assign((string *)&this->base_extkey_);
  ::std::__cxx11::string::_M_assign((string *)&this->tweak_sum_);
  this->number_ = object->number_;
  ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::operator=
            (&this->child_node_,&object->child_node_);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  ::operator=(&(this->tree_node_)._M_t,&(object->tree_node_)._M_t);
  ::std::__cxx11::string::_M_assign((string *)&this->checksum_);
  uVar2 = object->need_arg_num_;
  DVar3 = object->node_type_;
  DVar4 = object->script_type_;
  this->depth_ = object->depth_;
  this->need_arg_num_ = uVar2;
  this->node_type_ = DVar3;
  this->script_type_ = DVar4;
  this->key_type_ = object->key_type_;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&this->addr_prefixes_,&object->addr_prefixes_);
  ::std::__cxx11::string::_M_assign((string *)&this->parent_kind_);
  return;
}

Assistant:

DescriptorNode::DescriptorNode(const DescriptorNode& object) {
  name_ = object.name_;
  value_ = object.value_;
  key_info_ = object.key_info_;
  is_uncompressed_key_ = object.is_uncompressed_key_;
  base_extkey_ = object.base_extkey_;
  tweak_sum_ = object.tweak_sum_;
  number_ = object.number_;
  child_node_ = object.child_node_;
  tree_node_ = object.tree_node_;
  checksum_ = object.checksum_;
  depth_ = object.depth_;
  need_arg_num_ = object.need_arg_num_;
  node_type_ = object.node_type_;
  script_type_ = object.script_type_;
  key_type_ = object.key_type_;
  addr_prefixes_ = object.addr_prefixes_;
  parent_kind_ = object.parent_kind_;
}